

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapePiram>::ComputeMasterDirections(TPZShapeData *data)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  long in_RDI;
  int il;
  int ivet;
  int nvec;
  int side;
  int cont;
  int lastface;
  int firstface;
  int i;
  TPZFNMatrix<9,_double> gradx;
  int dim;
  int64_t numvec;
  TPZFMatrix<double> *in_stack_00000928;
  TPZFMatrix<double> *in_stack_00000930;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  double *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int iVar5;
  undefined4 in_stack_fffffffffffffed4;
  int iVar6;
  undefined4 in_stack_fffffffffffffed8;
  int iVar7;
  undefined4 in_stack_fffffffffffffedc;
  int side_00;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar8;
  undefined4 in_stack_fffffffffffffee8;
  int iVar9;
  undefined4 in_stack_fffffffffffffeec;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffef0;
  undefined4 local_104;
  int64_t in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  TPZFMatrix<double> *in_stack_ffffffffffffff28;
  
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (double *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
    in_stack_fffffffffffffec8 =
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)
                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    (int64_t)in_stack_fffffffffffffec8,
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    *in_stack_fffffffffffffec8 = 1.0;
  }
  pztopology::TPZPyramid::ComputeHDivDirections<double>(in_stack_00000930,in_stack_00000928);
  iVar9 = 0xd;
  iVar8 = 0x12;
  for (side_00 = 0xd; side_00 < iVar8; side_00 = side_00 + 1) {
    iVar2 = pztopology::TPZPyramid::NContainedSides(side_00);
    iVar7 = iVar2;
    for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
      for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x2c70),(long)(side_00 - iVar9));
        iVar1 = *piVar3;
        pdVar4 = TPZFMatrix<double>::operator()
                           ((TPZFMatrix<double> *)CONCAT44(iVar6,iVar5),
                            (int64_t)in_stack_fffffffffffffec8,
                            CONCAT44(iVar2,in_stack_fffffffffffffec0));
        *pdVar4 = (double)iVar1 * *pdVar4;
      }
    }
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x18b2334);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeMasterDirections(TPZShapeData &data)
{
    int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    data.fMasterDirections.Resize(3,numvec);
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    for (int i = 0; i < TSHAPE::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TSHAPE::ComputeHDivDirections(gradx, data.fMasterDirections);
    
    int firstface = TSHAPE::NSides - TSHAPE::NFacets - 1;
    int lastface = TSHAPE::NSides - 1;
    int cont = 0;
    for(int side = firstface; side < lastface; side++)
    {
        int nvec = TSHAPE::NContainedSides(side);
        for (int ivet = 0; ivet<nvec; ivet++)
        {
            for (int il = 0; il<dim; il++)
            {
              data.fMasterDirections(il,ivet+cont) *= data.fSideOrient[side-firstface];
            }
        }
        cont += nvec;
    }
    
}